

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

void __thiscall BufferedReader::~BufferedReader(BufferedReader *this)

{
  ~BufferedReader((BufferedReader *)
                  &this[-1].m_readers._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  return;
}

Assistant:

BufferedReader::~BufferedReader()
{
    terminate();
    m_readQueue.push(0);
    join();
    for (const auto& m_reader : m_readers)
    {
        const ReaderData* pData = m_reader.second;
        delete pData;
    }
}